

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCRgba.cpp
# Opt level: O0

void anon_unknown.dwarf_20d0d3::writeReadCRGBA
               (char *fileName,int width,int height,Array2D<ImfRgba> *p1,RgbaChannels channels,
               LineOrder lorder,Compression comp)

{
  ImfHalf IVar1;
  ImfRgba IVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ostream *poVar9;
  void *this;
  undefined8 uVar10;
  ImfRgba *pIVar11;
  Array2D<Imf_3_4::Rgba> *in_RCX;
  int in_EDX;
  int in_ESI;
  char *pcVar12;
  char *in_RDI;
  uint in_R8D;
  int in_R9D;
  bool bVar13;
  float fVar14;
  float fVar15;
  int in_stack_00000008;
  int inputFileClosed;
  int x_1;
  int y_1;
  Array2D<Imf_3_4::Rgba> p2_temp_1;
  Array2D<Imf_3_4::Rgba> p1_temp_1;
  Array2D<Imf_3_4::Rgba> p2_temp;
  Array2D<Imf_3_4::Rgba> p1_temp;
  float yScreenWindowCenter;
  float xScreenWindowCenter;
  int yMaxDisplayWindow;
  int xMaxDisplayWindow;
  int yMinDisplayWindow;
  int xMinDisplayWindow;
  int yMaxDataWindow;
  int xMaxDataWindow;
  int yMinDataWindow;
  int xMinDataWindow;
  int successReadPixels;
  int successSetFrameBuffer;
  int x;
  int y;
  Array2D<ImfRgba> p2;
  int dy;
  int dx;
  int h;
  int w;
  int yMax;
  int xMax;
  int yMin;
  int xMin;
  ImfHeader *inputFileHeaderPtr;
  ImfInputFile *in;
  int outputFileClosed;
  ImfOutputFile *out;
  float yScreenWindowCenterOut;
  float xScreenWindowCenterOut;
  ImfHeader *headerPtr;
  float in_stack_fffffffffffffe20;
  uint in_stack_fffffffffffffe24;
  long in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  Array2D<Imf_3_4::Rgba> *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  undefined8 in_stack_fffffffffffffe58;
  RgbaChannels RVar16;
  int in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  int in_stack_fffffffffffffe68;
  int local_140;
  int local_13c;
  float local_d8;
  float local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_9c;
  undefined2 local_98;
  undefined2 uStack_96;
  undefined2 uStack_94;
  ImfHalf IStack_92;
  int local_90;
  int local_8c;
  Array2D<ImfRgba> local_88;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  undefined8 local_50;
  long local_48;
  int local_3c;
  undefined8 local_38;
  float local_30;
  float local_2c [2];
  
  poVar9 = std::operator<<((ostream *)&std::cout,"channels ");
  pcVar12 = "";
  if ((in_R8D & 1) != 0) {
    pcVar12 = "R";
  }
  poVar9 = std::operator<<(poVar9,pcVar12);
  pcVar12 = "";
  if ((in_R8D & 2) != 0) {
    pcVar12 = "G";
  }
  poVar9 = std::operator<<(poVar9,pcVar12);
  pcVar12 = "";
  if ((in_R8D & 4) != 0) {
    pcVar12 = "B";
  }
  poVar9 = std::operator<<(poVar9,pcVar12);
  pcVar12 = "";
  if ((in_R8D & 8) != 0) {
    pcVar12 = "A";
  }
  poVar9 = std::operator<<(poVar9,pcVar12);
  poVar9 = std::operator<<(poVar9,", line order ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,in_R9D);
  poVar9 = std::operator<<(poVar9,", compression ");
  this = (void *)std::ostream::operator<<(poVar9,in_stack_00000008);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  register0x00000000 = ImfNewHeader();
  ImfHeaderSetLineOrder(register0x00000000,in_R9D);
  ImfHeaderSetCompression(stack0xffffffffffffffd8,in_stack_00000008);
  ImfHeaderSetDataWindow(stack0xffffffffffffffd8,0,0,in_ESI + -1,in_EDX + -1);
  ImfHeaderSetDisplayWindow(stack0xffffffffffffffd8,0,0,in_ESI + -1,in_EDX + -1);
  ImfHeaderScreenWindowCenter(stack0xffffffffffffffd8,local_2c,&local_30);
  std::operator<<((ostream *)&std::cout,"writing ");
  std::ostream::flush();
  remove(in_RDI);
  uVar10 = ImfOpenOutputFile(in_RDI,stack0xffffffffffffffd8,in_R8D);
  local_38 = uVar10;
  pIVar11 = Imf_3_4::Array2D<ImfRgba>::operator[]((Array2D<ImfRgba> *)in_RCX,0);
  ImfOutputSetFrameBuffer(uVar10,pIVar11,1,(long)in_ESI);
  ImfOutputWritePixels(local_38,in_EDX);
  local_3c = ImfCloseOutputFile(local_38);
  if (local_3c != 1) {
    __assert_fail("outputFileClosed == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0x6e,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  std::operator<<((ostream *)&std::cout,"reading ");
  std::ostream::flush();
  local_48 = ImfOpenInputFile(in_RDI);
  if (local_48 == 0) {
    __assert_fail("in != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0x76,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  local_50 = ImfInputHeader(local_48);
  ImfHeaderDataWindow(local_50,&local_54,&local_58,&local_5c,&local_60);
  local_64 = (local_5c - local_54) + 1;
  local_68 = (local_60 - local_58) + 1;
  local_6c = local_54;
  local_70 = local_58;
  Imf_3_4::Array2D<ImfRgba>::Array2D
            ((Array2D<ImfRgba> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             in_stack_fffffffffffffe28,CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)
            );
  for (local_8c = 0; lVar4 = local_48,
      RVar16 = (RgbaChannels)((ulong)in_stack_fffffffffffffe58 >> 0x20), local_8c < local_68;
      local_8c = local_8c + 1) {
    for (local_90 = 0; local_90 < local_64; local_90 = local_90 + 1) {
      local_98 = 0;
      uStack_96 = 0;
      uStack_94 = 0;
      IStack_92 = 1;
      pIVar11 = Imf_3_4::Array2D<ImfRgba>::operator[](&local_88,(long)local_8c);
      IVar2.g = uStack_96;
      IVar2.r = local_98;
      IVar2.b = uStack_94;
      IVar2.a = IStack_92;
      pIVar11[local_90] = IVar2;
    }
  }
  pIVar11 = Imf_3_4::Array2D<ImfRgba>::operator[](&local_88,(long)-local_70);
  local_9c = ImfInputSetFrameBuffer(lVar4,pIVar11 + -local_6c,1,(long)local_64);
  if (local_9c != 1) {
    __assert_fail("successSetFrameBuffer == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0x89,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  local_b0 = ImfInputReadPixels(local_48,local_58,local_60);
  if (local_b0 != 1) {
    __assert_fail("successReadPixels == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0x8b,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  ImfHeaderDataWindow(local_50,&local_b4,&local_b8,&local_bc,&local_c0);
  ImfHeaderDisplayWindow(local_50,&local_c4,&local_c8,&local_cc,&local_d0);
  ImfHeaderScreenWindowCenter(local_50,&local_d4,&local_d8);
  bVar13 = false;
  if (((local_c4 == 0) && (bVar13 = false, local_c8 == 0)) &&
     (bVar13 = false, local_cc == in_ESI + -1)) {
    bVar13 = local_d0 == in_EDX + -1;
  }
  if (!bVar13) {
    __assert_fail("(xMinDisplayWindow == 0) && (yMinDisplayWindow == 0) && (xMaxDisplayWindow == width - 1) && (yMaxDisplayWindow == height - 1)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0x9a,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  bVar13 = false;
  if (((local_b4 == 0) && (bVar13 = false, local_b8 == 0)) &&
     (bVar13 = false, local_bc == in_ESI + -1)) {
    bVar13 = local_c0 == in_EDX + -1;
  }
  if (!bVar13) {
    __assert_fail("(xMinDataWindow == 0) && (yMinDataWindow == 0) && (xMaxDataWindow == width - 1) && (yMaxDataWindow == height - 1)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0x9c,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  fVar14 = (float)ImfHeaderPixelAspectRatio(local_50);
  fVar15 = (float)ImfHeaderPixelAspectRatio(stack0xffffffffffffffd8);
  if ((fVar14 != fVar15) || (NAN(fVar14) || NAN(fVar15))) {
    __assert_fail("ImfHeaderPixelAspectRatio(inputFileHeaderPtr) == ImfHeaderPixelAspectRatio (headerPtr)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0x9e,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  bVar13 = false;
  if ((local_d4 == local_2c[0]) && (!NAN(local_d4) && !NAN(local_2c[0]))) {
    bVar13 = local_d8 == local_30;
  }
  if (bVar13) {
    fVar14 = (float)ImfHeaderScreenWindowWidth(local_50);
    fVar15 = (float)ImfHeaderScreenWindowWidth(stack0xffffffffffffffd8);
    if ((fVar14 != fVar15) || (NAN(fVar14) || NAN(fVar15))) {
      __assert_fail("ImfHeaderScreenWindowWidth (inputFileHeaderPtr) == ImfHeaderScreenWindowWidth (headerPtr)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                    ,0xa2,
                    "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                   );
    }
    iVar5 = ImfHeaderLineOrder(local_50);
    iVar6 = ImfHeaderLineOrder(stack0xffffffffffffffd8);
    if (iVar5 != iVar6) {
      __assert_fail("ImfHeaderLineOrder (inputFileHeaderPtr) == ImfHeaderLineOrder (headerPtr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                    ,0xa4,
                    "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                   );
    }
    iVar5 = ImfHeaderCompression(local_50);
    iVar6 = ImfHeaderCompression(stack0xffffffffffffffd8);
    if (iVar5 == iVar6) {
      uVar7 = ImfInputChannels(local_48);
      if (uVar7 != in_R8D) {
        __assert_fail("ImfInputChannels (in) == channels",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                      ,0xa8,
                      "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                     );
      }
      iVar5 = ImfHeaderCompression(local_50);
      if ((iVar5 == 6) ||
         (in_stack_fffffffffffffe68 = ImfHeaderCompression(local_50), in_stack_fffffffffffffe68 == 7
         )) {
        Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D
                  ((Array2D<Imf_3_4::Rgba> *)CONCAT44(iVar6,uVar7),
                   CONCAT44(iVar5,in_stack_fffffffffffffe68),
                   CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D
                  ((Array2D<Imf_3_4::Rgba> *)CONCAT44(iVar6,uVar7),
                   CONCAT44(iVar5,in_stack_fffffffffffffe68),
                   CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        convertImfRgbaToRgbaPixels
                  ((Array2D<ImfRgba> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40)
                   ,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
        convertImfRgbaToRgbaPixels
                  ((Array2D<ImfRgba> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40)
                   ,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
        uVar10 = stack0xffffffffffffffd8;
        uVar3 = (ulong)stack0xffffffffffffffd8 >> 0x20;
        RVar16 = (RgbaChannels)uVar3;
        unique0x1000105f = uVar10;
        compareB44(in_ESI,in_EDX,in_RCX,(Array2D<Imf_3_4::Rgba> *)CONCAT44(in_R8D,in_R9D),RVar16);
        Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D
                  ((Array2D<Imf_3_4::Rgba> *)
                   CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D
                  ((Array2D<Imf_3_4::Rgba> *)
                   CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      }
      else {
        iVar8 = ImfHeaderCompression(local_50);
        if ((iVar8 == 8) ||
           (in_stack_fffffffffffffe60 = ImfHeaderCompression(local_50),
           in_stack_fffffffffffffe60 == 9)) {
          Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D
                    ((Array2D<Imf_3_4::Rgba> *)CONCAT44(iVar6,uVar7),
                     CONCAT44(iVar5,in_stack_fffffffffffffe68),
                     CONCAT44(iVar8,in_stack_fffffffffffffe60));
          Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D
                    ((Array2D<Imf_3_4::Rgba> *)CONCAT44(iVar6,uVar7),
                     CONCAT44(iVar5,in_stack_fffffffffffffe68),
                     CONCAT44(iVar8,in_stack_fffffffffffffe60));
          convertImfRgbaToRgbaPixels
                    ((Array2D<ImfRgba> *)
                     CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                     in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
          convertImfRgbaToRgbaPixels
                    ((Array2D<ImfRgba> *)
                     CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                     in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
          compareDwa(iVar6,uVar7,(Array2D<Imf_3_4::Rgba> *)CONCAT44(iVar5,in_stack_fffffffffffffe68)
                     ,(Array2D<Imf_3_4::Rgba> *)CONCAT44(iVar8,in_stack_fffffffffffffe60),RVar16);
          Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D
                    ((Array2D<Imf_3_4::Rgba> *)
                     CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
          Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D
                    ((Array2D<Imf_3_4::Rgba> *)
                     CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        }
        else {
          for (local_13c = 0; local_13c < local_68; local_13c = local_13c + 1) {
            for (local_140 = 0; local_140 < local_64; local_140 = local_140 + 1) {
              if ((in_R8D & 1) == 0) {
                pIVar11 = Imf_3_4::Array2D<ImfRgba>::operator[](&local_88,(long)local_13c);
                fVar14 = (float)ImfHalfToFloat(pIVar11[local_140].r);
                if ((fVar14 != 0.0) || (NAN(fVar14))) {
                  __assert_fail("ImfHalfToFloat(p2[y][x].r) == 0.0",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                                ,0xc6,
                                "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                               );
                }
              }
              else {
                pIVar11 = Imf_3_4::Array2D<ImfRgba>::operator[](&local_88,(long)local_13c);
                IVar1 = pIVar11[local_140].r;
                pIVar11 = Imf_3_4::Array2D<ImfRgba>::operator[]
                                    ((Array2D<ImfRgba> *)in_RCX,(long)local_13c);
                if (IVar1 != pIVar11[local_140].r) {
                  __assert_fail("p2[y][x].r == p1[y][x].r",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                                ,0xc4,
                                "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                               );
                }
              }
              if ((in_R8D & 2) == 0) {
                pIVar11 = Imf_3_4::Array2D<ImfRgba>::operator[](&local_88,(long)local_13c);
                fVar14 = (float)ImfHalfToFloat(pIVar11[local_140].g);
                if ((fVar14 != 0.0) || (NAN(fVar14))) {
                  __assert_fail("ImfHalfToFloat(p2[y][x].g) == 0.0",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                                ,0xcb,
                                "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                               );
                }
              }
              else {
                pIVar11 = Imf_3_4::Array2D<ImfRgba>::operator[](&local_88,(long)local_13c);
                uVar7 = (uint)pIVar11[local_140].g;
                pIVar11 = Imf_3_4::Array2D<ImfRgba>::operator[]
                                    ((Array2D<ImfRgba> *)in_RCX,(long)local_13c);
                if (uVar7 != pIVar11[local_140].g) {
                  __assert_fail("p2[y][x].g == p1[y][x].g",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                                ,0xc9,
                                "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                               );
                }
              }
              if ((in_R8D & 4) == 0) {
                pIVar11 = Imf_3_4::Array2D<ImfRgba>::operator[](&local_88,(long)local_13c);
                fVar14 = (float)ImfHalfToFloat(pIVar11[local_140].b);
                if ((fVar14 != 0.0) || (NAN(fVar14))) {
                  __assert_fail("ImfHalfToFloat(p2[y][x].b) == 0.0",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                                ,0xd0,
                                "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                               );
                }
              }
              else {
                pIVar11 = Imf_3_4::Array2D<ImfRgba>::operator[](&local_88,(long)local_13c);
                uVar7 = (uint)pIVar11[local_140].b;
                pIVar11 = Imf_3_4::Array2D<ImfRgba>::operator[]
                                    ((Array2D<ImfRgba> *)in_RCX,(long)local_13c);
                if (uVar7 != pIVar11[local_140].b) {
                  __assert_fail("p2[y][x].b == p1[y][x].b",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                                ,0xce,
                                "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                               );
                }
              }
              if ((in_R8D & 8) == 0) {
                pIVar11 = Imf_3_4::Array2D<ImfRgba>::operator[](&local_88,(long)local_13c);
                in_stack_fffffffffffffe20 = (float)ImfHalfToFloat(pIVar11[local_140].a);
                if ((in_stack_fffffffffffffe20 != 1.0) || (NAN(in_stack_fffffffffffffe20))) {
                  __assert_fail("ImfHalfToFloat(p2[y][x].a) == 1.0",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                                ,0xd5,
                                "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                               );
                }
              }
              else {
                pIVar11 = Imf_3_4::Array2D<ImfRgba>::operator[](&local_88,(long)local_13c);
                in_stack_fffffffffffffe24 = (uint)pIVar11[local_140].a;
                pIVar11 = Imf_3_4::Array2D<ImfRgba>::operator[]
                                    ((Array2D<ImfRgba> *)in_RCX,(long)local_13c);
                if (in_stack_fffffffffffffe24 != pIVar11[local_140].a) {
                  __assert_fail("p2[y][x].a == p1[y][x].a",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                                ,0xd3,
                                "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                               );
                }
              }
            }
          }
        }
      }
      iVar5 = ImfCloseInputFile(local_48);
      if (iVar5 != 1) {
        __assert_fail("inputFileClosed == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                      ,0xdb,
                      "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                     );
      }
      Imf_3_4::Array2D<ImfRgba>::~Array2D
                ((Array2D<ImfRgba> *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      ImfDeleteHeader(stack0xffffffffffffffd8);
      remove(in_RDI);
      return;
    }
    __assert_fail("ImfHeaderCompression (inputFileHeaderPtr) == ImfHeaderCompression (headerPtr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0xa6,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  __assert_fail("(xScreenWindowCenter == xScreenWindowCenterOut) && (yScreenWindowCenter == yScreenWindowCenterOut)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                ,0xa0,
                "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
               );
}

Assistant:

void
writeReadCRGBA (
    const char           fileName[],
    int                  width,
    int                  height,
    const Array2D<ImfRgba>& p1,
    RgbaChannels         channels,
    LineOrder            lorder,
    Compression          comp)
{
    // 
    // Save the selected channels of RGBA image p1; save the
    // scan lines in the specified order.  Read the image back
    // from the file, and compare the data with the original.
    //

    cout << "channels " << ((channels & IMF_WRITE_R) ? "R" : "")
         << ((channels & IMF_WRITE_G) ? "G" : "")
         << ((channels & IMF_WRITE_B) ? "B" : "")
         << ((channels & IMF_WRITE_A) ? "A" : "") << ", line order " << lorder
         << ", compression " << comp << endl;

    ImfHeader* headerPtr = ImfNewHeader ();
    ImfHeaderSetLineOrder (headerPtr, lorder);
    ImfHeaderSetCompression (headerPtr, comp);
    ImfHeaderSetDataWindow (headerPtr, 0, 0, width - 1, height - 1);
    ImfHeaderSetDisplayWindow (headerPtr, 0, 0, width - 1, height - 1);

    // Get screenWindowCenter for comparison
    float xScreenWindowCenterOut, yScreenWindowCenterOut;
    ImfHeaderScreenWindowCenter (headerPtr, &xScreenWindowCenterOut, &yScreenWindowCenterOut);

    cout << "writing ";
    cout.flush ();

    {
        remove (fileName);
        ImfOutputFile* out = ImfOpenOutputFile (fileName, headerPtr, channels);
        ImfOutputSetFrameBuffer (out, &p1[0][0], 1, width);
        ImfOutputWritePixels (out, height);
        int outputFileClosed = ImfCloseOutputFile (out);
        assert (outputFileClosed == 1);
    }

    cout << "reading ";
    cout.flush ();

    {
        ImfInputFile* in = ImfOpenInputFile (fileName);
        assert (in != NULL);
        const ImfHeader* inputFileHeaderPtr = ImfInputHeader (in);
        int xMin, yMin, xMax, yMax;
        ImfHeaderDataWindow (inputFileHeaderPtr, &xMin, &yMin, &xMax, &yMax);

        int w  = xMax - xMin + 1;
        int h  = yMax - yMin + 1;
        int dx = xMin;
        int dy = yMin;

        Array2D<ImfRgba> p2 (h, w);
        for (int y = 0; y < h; ++y)
        {
            for (int x = 0; x < w; ++x)
            {
                p2[y][x] = {0, 0, 0, 1};
            }
        }
        int successSetFrameBuffer = ImfInputSetFrameBuffer (in, &p2[-dy][-dx], 1, w);
        assert (successSetFrameBuffer == 1);
        int successReadPixels = ImfInputReadPixels (in, yMin, yMax);
        assert (successReadPixels == 1);

        // Get inputFile dataWindow
        int xMinDataWindow, yMinDataWindow, xMaxDataWindow, yMaxDataWindow;
        ImfHeaderDataWindow (inputFileHeaderPtr, &xMinDataWindow, &yMinDataWindow, &xMaxDataWindow, &yMaxDataWindow);

        // Get inputFile displayWindow
        int xMinDisplayWindow, yMinDisplayWindow, xMaxDisplayWindow, yMaxDisplayWindow;
        ImfHeaderDisplayWindow (inputFileHeaderPtr, &xMinDisplayWindow, &yMinDisplayWindow, &xMaxDisplayWindow, &yMaxDisplayWindow);

        // Get inputFile screenWindowCenter
        float xScreenWindowCenter, yScreenWindowCenter;
        ImfHeaderScreenWindowCenter (inputFileHeaderPtr, &xScreenWindowCenter, &yScreenWindowCenter);

        // Compare displayWindow
        assert ((xMinDisplayWindow == 0) && (yMinDisplayWindow == 0) && (xMaxDisplayWindow == width - 1) && (yMaxDisplayWindow == height - 1));
        // Compare dataWindow
        assert ((xMinDataWindow == 0) && (yMinDataWindow == 0) && (xMaxDataWindow == width - 1) && (yMaxDataWindow == height - 1));
        // Compare pixelAspectRatio
        assert (ImfHeaderPixelAspectRatio(inputFileHeaderPtr) == ImfHeaderPixelAspectRatio (headerPtr));
        // Compare screenWindowCenter
        assert ((xScreenWindowCenter == xScreenWindowCenterOut) && (yScreenWindowCenter == yScreenWindowCenterOut));
        // Compare screenWindowWidth
        assert (ImfHeaderScreenWindowWidth (inputFileHeaderPtr) == ImfHeaderScreenWindowWidth (headerPtr));
        // Compare lineOrder
        assert (ImfHeaderLineOrder (inputFileHeaderPtr) == ImfHeaderLineOrder (headerPtr));
        // Compare compression
        assert (ImfHeaderCompression (inputFileHeaderPtr) == ImfHeaderCompression (headerPtr));
        // Compare channels
        assert(ImfInputChannels (in) == channels);

        if (ImfHeaderCompression(inputFileHeaderPtr) == IMF_B44_COMPRESSION ||
            ImfHeaderCompression(inputFileHeaderPtr) == IMF_B44A_COMPRESSION)
        {
            Array2D<Rgba> p1_temp (h,w);
            Array2D<Rgba> p2_temp (h,w);
            convertImfRgbaToRgbaPixels (p1, p1_temp, w, h);
            convertImfRgbaToRgbaPixels (p2, p2_temp, w, h);
            compareB44 (width, height, p1_temp, p2_temp, channels);
        }
        else if (
            ImfHeaderCompression (inputFileHeaderPtr) == IMF_DWAA_COMPRESSION ||
            ImfHeaderCompression (inputFileHeaderPtr) == IMF_DWAB_COMPRESSION)
        {
            Array2D<Rgba> p1_temp (h, w);
            Array2D<Rgba> p2_temp (h, w);
            convertImfRgbaToRgbaPixels (p1, p1_temp, w, h);
            convertImfRgbaToRgbaPixels (p2, p2_temp, w, h);
            compareDwa (width, height, p1_temp, p2_temp, channels);
        }
        else
        {
            for (int y = 0; y < h; ++y)
            {
                for (int x = 0; x < w; ++x)
                {  
                    if (channels & IMF_WRITE_R)
                        assert (p2[y][x].r == p1[y][x].r);
                    else
                        assert (ImfHalfToFloat(p2[y][x].r) == 0.0);

                    if (channels & IMF_WRITE_G)
                        assert (p2[y][x].g == p1[y][x].g);
                    else
                        assert (ImfHalfToFloat(p2[y][x].g) == 0.0);

                    if (channels & IMF_WRITE_B)
                        assert (p2[y][x].b == p1[y][x].b);
                    else
                        assert (ImfHalfToFloat(p2[y][x].b) == 0.0);

                    if (channels & IMF_WRITE_A) 
                        assert (p2[y][x].a == p1[y][x].a);
                    else
                        assert (ImfHalfToFloat(p2[y][x].a) == 1.0);       
                }
            }
        }

        int inputFileClosed = ImfCloseInputFile (in);
        assert (inputFileClosed == 1);
    }
    ImfDeleteHeader(headerPtr);
    remove (fileName);
}